

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

bool google::protobuf::internal::
     SplitFieldHasExtraIndirectionStatic<google::protobuf::Message_const*>(FieldDescriptor *field)

{
  bool bVar1;
  FieldDescriptor *field_local;
  
  bVar1 = SplitFieldHasExtraIndirection(field);
  return bVar1;
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}